

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O2

Token __thiscall Lexer::ReadToken(Lexer *this)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  Token TVar5;
  byte *pbVar6;
  byte bVar7;
  
  pbVar6 = (byte *)this->ofs_;
LAB_0012050c:
  bVar7 = *pbVar6;
  if (bVar7 == 0x20) goto code_r0x00120514;
  pbVar4 = pbVar6;
  if (bVar7 < 0x5f) {
    if (bVar7 < 0x2d) {
      if (bVar7 < 0xd) {
        pbVar3 = pbVar6;
        if (bVar7 == 0) {
          TVar5 = TEOF;
        }
        else {
          if (bVar7 != 10) goto LAB_0012085e;
          TVar5 = NEWLINE;
        }
        goto LAB_00120718;
      }
      if (bVar7 != 0x23) {
        if ((bVar7 != 0xd) || (pbVar3 = pbVar6 + 1, pbVar6[1] != 10)) goto LAB_0012085e;
        goto LAB_001205d8;
      }
      pbVar4 = pbVar6 + 1;
      bVar7 = pbVar6[1];
      if (bVar7 == 0) goto LAB_0012085e;
      bVar1 = true;
      pbVar2 = pbVar4;
      while (bVar7 != 10) {
        if (bVar7 == 0) {
          TVar5 = INDENT;
          if (bVar1) {
            TVar5 = ERROR;
          }
          goto LAB_00120939;
        }
LAB_00120576:
        bVar7 = pbVar2[1];
        pbVar2 = pbVar2 + 1;
      }
      pbVar6 = pbVar2 + 1;
      goto LAB_0012050c;
    }
    if (bVar7 < 0x3b) {
      if (bVar7 != 0x2f) {
        if (bVar7 != 0x3a) goto LAB_00120920;
        pbVar4 = pbVar6 + 1;
        TVar5 = COLON;
        goto LAB_00120939;
      }
    }
    else {
      if (0x3d < bVar7) {
        if (0x19 < (byte)(bVar7 + 0xbf)) goto LAB_0012085e;
        goto LAB_00120920;
      }
      if (bVar7 == 0x3d) {
        pbVar4 = pbVar6 + 1;
        TVar5 = EQUALS;
        goto LAB_00120939;
      }
    }
  }
  else if (bVar7 < 0x6a) {
    if (0x62 < bVar7) {
      if (bVar7 == 100) {
        bVar7 = pbVar6[1];
        if (bVar7 != 0x65) goto LAB_001208e6;
        bVar7 = pbVar6[2];
        if (bVar7 != 0x66) goto LAB_001208ec;
        bVar7 = pbVar6[3];
        if (bVar7 != 0x61) goto LAB_001208f2;
        bVar7 = pbVar6[4];
        if (bVar7 == 0x75) {
          bVar7 = pbVar6[5];
          if (bVar7 != 0x6c) goto LAB_0012090e;
          bVar7 = pbVar6[6];
          if (bVar7 != 0x74) goto LAB_00120914;
          pbVar4 = pbVar6 + 7;
          if ((""[pbVar6[7]] & 0x40) != 0) goto LAB_00120920;
          TVar5 = DEFAULT;
          goto LAB_00120939;
        }
      }
      else {
        if (bVar7 != 0x69) goto LAB_00120920;
        bVar7 = pbVar6[1];
        if (bVar7 != 0x6e) {
LAB_001208e6:
          pbVar4 = pbVar6 + 1;
          goto LAB_00120926;
        }
        bVar7 = pbVar6[2];
        if (bVar7 != 99) {
LAB_001208ec:
          pbVar4 = pbVar6 + 2;
          goto LAB_00120926;
        }
        bVar7 = pbVar6[3];
        if (bVar7 != 0x6c) goto LAB_001208f2;
        bVar7 = pbVar6[4];
        if (bVar7 == 0x75) {
          bVar7 = pbVar6[5];
          if (bVar7 != 100) {
LAB_0012090e:
            pbVar4 = pbVar6 + 5;
            goto LAB_00120926;
          }
          bVar7 = pbVar6[6];
          if (bVar7 != 0x65) {
LAB_00120914:
            pbVar4 = pbVar6 + 6;
            goto LAB_00120926;
          }
          pbVar4 = pbVar6 + 7;
          if ((""[pbVar6[7]] & 0x40) != 0) goto LAB_00120920;
          TVar5 = INCLUDE;
          goto LAB_00120939;
        }
      }
LAB_00120908:
      pbVar4 = pbVar6 + 4;
      goto LAB_00120926;
    }
    if (bVar7 != 0x60) {
      if (bVar7 != 0x62) goto LAB_00120920;
      bVar7 = pbVar6[1];
      if (bVar7 != 0x75) goto LAB_001208e6;
      bVar7 = pbVar6[2];
      if (bVar7 != 0x69) goto LAB_001208ec;
      bVar7 = pbVar6[3];
      if (bVar7 != 0x6c) goto LAB_001208f2;
      bVar7 = pbVar6[4];
      if (bVar7 != 100) goto LAB_00120908;
      pbVar4 = pbVar6 + 5;
      if ((""[pbVar6[5]] & 0x40) != 0) goto LAB_00120920;
      TVar5 = BUILD;
      goto LAB_00120939;
    }
  }
  else {
    if (bVar7 < 0x73) {
      if (bVar7 == 0x70) {
        bVar7 = pbVar6[1];
        if (bVar7 != 0x6f) goto LAB_001208e6;
        bVar7 = pbVar6[2];
        if (bVar7 != 0x6f) goto LAB_001208ec;
        bVar7 = pbVar6[3];
        if (bVar7 == 0x6c) {
          pbVar4 = pbVar6 + 4;
          if ((""[pbVar6[4]] & 0x40) != 0) goto LAB_00120920;
          TVar5 = POOL;
          goto LAB_00120939;
        }
      }
      else {
        if (bVar7 != 0x72) goto LAB_00120920;
        bVar7 = pbVar6[1];
        if (bVar7 != 0x75) goto LAB_001208e6;
        bVar7 = pbVar6[2];
        if (bVar7 != 0x6c) goto LAB_001208ec;
        bVar7 = pbVar6[3];
        if (bVar7 == 0x65) {
          pbVar4 = pbVar6 + 4;
          if ((""[pbVar6[4]] & 0x40) != 0) goto LAB_00120920;
          TVar5 = RULE;
          goto LAB_00120939;
        }
      }
LAB_001208f2:
      pbVar4 = pbVar6 + 3;
      goto LAB_00120926;
    }
    if (bVar7 < 0x7b) {
      if (bVar7 != 0x73) goto LAB_00120920;
      bVar7 = pbVar6[1];
      if (bVar7 != 0x75) goto LAB_001208e6;
      bVar7 = pbVar6[2];
      if (bVar7 != 0x62) goto LAB_001208ec;
      bVar7 = pbVar6[3];
      if (bVar7 != 0x6e) goto LAB_001208f2;
      bVar7 = pbVar6[4];
      if (bVar7 != 0x69) goto LAB_00120908;
      bVar7 = pbVar6[5];
      if (bVar7 != 0x6e) goto LAB_0012090e;
      bVar7 = pbVar6[6];
      if (bVar7 != 0x6a) goto LAB_00120914;
      bVar7 = pbVar6[7];
      if (bVar7 != 0x61) {
        pbVar4 = pbVar6 + 7;
        goto LAB_00120926;
      }
      pbVar4 = pbVar6 + 8;
      if ((""[pbVar6[8]] & 0x40) == 0) {
        TVar5 = SUBNINJA;
      }
      else {
LAB_00120920:
        do {
          bVar7 = pbVar4[1];
          pbVar4 = pbVar4 + 1;
LAB_00120926:
        } while ((""[bVar7] & 0x40) != 0);
        TVar5 = IDENT;
      }
      goto LAB_00120939;
    }
    if (bVar7 == 0x7c) {
      if (pbVar6[1] == 0x40) {
        pbVar4 = pbVar6 + 2;
        TVar5 = PIPEAT;
      }
      else if (pbVar6[1] == 0x7c) {
        pbVar4 = pbVar6 + 2;
        TVar5 = PIPE2;
      }
      else {
        pbVar4 = pbVar6 + 1;
        TVar5 = PIPE;
      }
      goto LAB_00120939;
    }
  }
LAB_0012085e:
  pbVar4 = pbVar6 + 1;
  TVar5 = ERROR;
  goto LAB_00120939;
code_r0x00120514:
  pbVar2 = pbVar6 + 1;
  do {
    pbVar4 = pbVar2;
    bVar7 = *pbVar4;
    pbVar2 = pbVar4 + 1;
  } while (bVar7 == 0x20);
  pbVar3 = pbVar4;
  if (0xc < bVar7) {
    if (bVar7 == 0x23) {
      bVar1 = false;
      pbVar2 = pbVar4;
      goto LAB_00120576;
    }
    if (bVar7 != 0xd) goto LAB_001205e0;
    bVar7 = *pbVar2;
    pbVar3 = pbVar2;
  }
  if (bVar7 == 10) {
LAB_001205d8:
    TVar5 = NEWLINE;
LAB_00120718:
    this->last_token_ = (char *)pbVar6;
    this->ofs_ = (char *)(pbVar3 + 1);
    return TVar5;
  }
LAB_001205e0:
  TVar5 = INDENT;
LAB_00120939:
  this->last_token_ = (char *)pbVar6;
  this->ofs_ = (char *)pbVar4;
  EatWhitespace(this);
  return TVar5;
}

Assistant:

Lexer::Token Lexer::ReadToken() {
  const char* p = ofs_;
  const char* q;
  const char* start;
  Lexer::Token token;
  for (;;) {
    start = p;
    
{
	unsigned char yych;
	unsigned int yyaccept = 0;
	static const unsigned char yybm[] = {
		  0, 128, 128, 128, 128, 128, 128, 128, 
		128, 128,   0, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		160, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 192, 192, 128, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 128, 128, 128, 128, 128, 128, 
		128, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 128, 128, 128, 128, 192, 
		128, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
	};
	yych = *p;
	if (yybm[0+yych] & 32) {
		goto yy9;
	}
	if (yych <= '^') {
		if (yych <= ',') {
			if (yych <= '\f') {
				if (yych <= 0x00) goto yy2;
				if (yych == '\n') goto yy6;
				goto yy4;
			} else {
				if (yych <= '\r') goto yy8;
				if (yych == '#') goto yy12;
				goto yy4;
			}
		} else {
			if (yych <= ':') {
				if (yych == '/') goto yy4;
				if (yych <= '9') goto yy13;
				goto yy16;
			} else {
				if (yych <= '=') {
					if (yych <= '<') goto yy4;
					goto yy18;
				} else {
					if (yych <= '@') goto yy4;
					if (yych <= 'Z') goto yy13;
					goto yy4;
				}
			}
		}
	} else {
		if (yych <= 'i') {
			if (yych <= 'b') {
				if (yych == '`') goto yy4;
				if (yych <= 'a') goto yy13;
				goto yy20;
			} else {
				if (yych == 'd') goto yy21;
				if (yych <= 'h') goto yy13;
				goto yy22;
			}
		} else {
			if (yych <= 'r') {
				if (yych == 'p') goto yy23;
				if (yych <= 'q') goto yy13;
				goto yy24;
			} else {
				if (yych <= 'z') {
					if (yych <= 's') goto yy25;
					goto yy13;
				} else {
					if (yych == '|') goto yy26;
					goto yy4;
				}
			}
		}
	}
yy2:
	++p;
	{ token = TEOF;     break; }
yy4:
	++p;
yy5:
	{ token = ERROR;    break; }
yy6:
	++p;
	{ token = NEWLINE;  break; }
yy8:
	yych = *++p;
	if (yych == '\n') goto yy28;
	goto yy5;
yy9:
	yyaccept = 0;
	yych = *(q = ++p);
	if (yybm[0+yych] & 32) {
		goto yy9;
	}
	if (yych <= '\f') {
		if (yych == '\n') goto yy6;
	} else {
		if (yych <= '\r') goto yy30;
		if (yych == '#') goto yy32;
	}
yy11:
	{ token = INDENT;   break; }
yy12:
	yyaccept = 1;
	yych = *(q = ++p);
	if (yych <= 0x00) goto yy5;
	goto yy33;
yy13:
	yych = *++p;
yy14:
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = IDENT;    break; }
yy16:
	++p;
	{ token = COLON;    break; }
yy18:
	++p;
	{ token = EQUALS;   break; }
yy20:
	yych = *++p;
	if (yych == 'u') goto yy36;
	goto yy14;
yy21:
	yych = *++p;
	if (yych == 'e') goto yy37;
	goto yy14;
yy22:
	yych = *++p;
	if (yych == 'n') goto yy38;
	goto yy14;
yy23:
	yych = *++p;
	if (yych == 'o') goto yy39;
	goto yy14;
yy24:
	yych = *++p;
	if (yych == 'u') goto yy40;
	goto yy14;
yy25:
	yych = *++p;
	if (yych == 'u') goto yy41;
	goto yy14;
yy26:
	yych = *++p;
	if (yych == '@') goto yy42;
	if (yych == '|') goto yy44;
	{ token = PIPE;     break; }
yy28:
	++p;
	{ token = NEWLINE;  break; }
yy30:
	yych = *++p;
	if (yych == '\n') goto yy28;
yy31:
	p = q;
	if (yyaccept == 0) {
		goto yy11;
	} else {
		goto yy5;
	}
yy32:
	yych = *++p;
yy33:
	if (yybm[0+yych] & 128) {
		goto yy32;
	}
	if (yych <= 0x00) goto yy31;
	++p;
	{ continue; }
yy36:
	yych = *++p;
	if (yych == 'i') goto yy46;
	goto yy14;
yy37:
	yych = *++p;
	if (yych == 'f') goto yy47;
	goto yy14;
yy38:
	yych = *++p;
	if (yych == 'c') goto yy48;
	goto yy14;
yy39:
	yych = *++p;
	if (yych == 'o') goto yy49;
	goto yy14;
yy40:
	yych = *++p;
	if (yych == 'l') goto yy50;
	goto yy14;
yy41:
	yych = *++p;
	if (yych == 'b') goto yy51;
	goto yy14;
yy42:
	++p;
	{ token = PIPEAT;   break; }
yy44:
	++p;
	{ token = PIPE2;    break; }
yy46:
	yych = *++p;
	if (yych == 'l') goto yy52;
	goto yy14;
yy47:
	yych = *++p;
	if (yych == 'a') goto yy53;
	goto yy14;
yy48:
	yych = *++p;
	if (yych == 'l') goto yy54;
	goto yy14;
yy49:
	yych = *++p;
	if (yych == 'l') goto yy55;
	goto yy14;
yy50:
	yych = *++p;
	if (yych == 'e') goto yy57;
	goto yy14;
yy51:
	yych = *++p;
	if (yych == 'n') goto yy59;
	goto yy14;
yy52:
	yych = *++p;
	if (yych == 'd') goto yy60;
	goto yy14;
yy53:
	yych = *++p;
	if (yych == 'u') goto yy62;
	goto yy14;
yy54:
	yych = *++p;
	if (yych == 'u') goto yy63;
	goto yy14;
yy55:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = POOL;     break; }
yy57:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = RULE;     break; }
yy59:
	yych = *++p;
	if (yych == 'i') goto yy64;
	goto yy14;
yy60:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = BUILD;    break; }
yy62:
	yych = *++p;
	if (yych == 'l') goto yy65;
	goto yy14;
yy63:
	yych = *++p;
	if (yych == 'd') goto yy66;
	goto yy14;
yy64:
	yych = *++p;
	if (yych == 'n') goto yy67;
	goto yy14;
yy65:
	yych = *++p;
	if (yych == 't') goto yy68;
	goto yy14;
yy66:
	yych = *++p;
	if (yych == 'e') goto yy70;
	goto yy14;
yy67:
	yych = *++p;
	if (yych == 'j') goto yy72;
	goto yy14;
yy68:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = DEFAULT;  break; }
yy70:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = INCLUDE;  break; }
yy72:
	yych = *++p;
	if (yych != 'a') goto yy14;
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = SUBNINJA; break; }
}

  }

  last_token_ = start;
  ofs_ = p;
  if (token != NEWLINE && token != TEOF)
    EatWhitespace();
  return token;
}